

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::CopyAELToSEL(Clipper *this)

{
  TEdge *pTVar1;
  TEdge *local_18;
  TEdge *e;
  Clipper *this_local;
  
  pTVar1 = this->m_ActiveEdges;
  this->m_SortedEdges = pTVar1;
  if (this->m_ActiveEdges != (TEdge *)0x0) {
    this->m_SortedEdges->prevInSEL = (TEdge *)0x0;
    for (local_18 = pTVar1->nextInAEL; local_18 != (TEdge *)0x0; local_18 = local_18->nextInAEL) {
      local_18->prevInSEL = local_18->prevInAEL;
      local_18->prevInSEL->nextInSEL = local_18;
      local_18->nextInSEL = (TEdge *)0x0;
    }
  }
  return;
}

Assistant:

void Clipper::CopyAELToSEL()
{
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  if (!m_ActiveEdges) return;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while ( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e = e->nextInAEL;
  }
}